

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

void CreateDamageFunction
               (PClassActor *info,AActor *defaults,FxExpression *id,bool fromDecorate,int lumpnum)

{
  FxReturnStatement *this;
  FxIntCast *this_00;
  PFunction *functype;
  VMFunction *pVVar1;
  AActor *size;
  undefined4 in_register_00000084;
  FString local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000084,lumpnum);
  if (id == (FxExpression *)0x0) {
    defaults->DamageFunc = (VMFunction *)0x0;
  }
  else {
    size = defaults;
    this = (FxReturnStatement *)FxExpression::operator_new((FxExpression *)0x30,(size_t)defaults);
    this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
    FxIntCast::FxIntCast(this_00,id,true,false);
    FxReturnStatement::FxReturnStatement(this,(FxExpression *)this_00,&id->ScriptPosition);
    functype = CreateAnonymousFunction(&info->super_PClass,(PType *)TypeSInt32,0);
    FStringf::FStringf((FStringf *)&local_40,"%s.DamageFunction",
                       FName::NameData.NameArray
                       [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        TypeName.Index].Text);
    pVVar1 = FFunctionBuildList::AddFunction
                       (&FunctionBuildList,functype,(FxExpression *)this,&local_40,fromDecorate,-1,0
                        ,(int)local_38);
    defaults->DamageFunc = pVVar1;
    FString::~FString(&local_40);
  }
  return;
}

Assistant:

void CreateDamageFunction(PClassActor *info, AActor *defaults, FxExpression *id, bool fromDecorate, int lumpnum)
{
	if (id == nullptr)
	{
		defaults->DamageFunc = nullptr;
	}
	else
	{
		auto dmg = new FxReturnStatement(new FxIntCast(id, true), id->ScriptPosition);
		auto funcsym = CreateAnonymousFunction(info, TypeSInt32, 0);
		defaults->DamageFunc = FunctionBuildList.AddFunction(funcsym, dmg, FStringf("%s.DamageFunction", info->TypeName.GetChars()), fromDecorate, -1, 0, lumpnum);
	}
}